

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

MessageLite * __thiscall google::protobuf::internal::ClassData::New(ClassData *this,Arena *arena)

{
  void *mem;
  MessageLite *pMVar1;
  ulong uVar2;
  
  pMVar1 = this->prototype;
  uVar2 = (ulong)(this->message_creator).allocation_size_;
  if (arena == (Arena *)0x0) {
    mem = operator_new(uVar2);
    arena = (Arena *)0x0;
  }
  else {
    mem = Arena::Allocate(arena,uVar2 + 7 & 0xfffffffffffffff8);
  }
  pMVar1 = MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
                     (&this->message_creator,pMVar1,pMVar1,mem,arena);
  return pMVar1;
}

Assistant:

MessageLite* New(Arena* arena) const {
    return message_creator.New(prototype, prototype, arena);
  }